

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsErrors.cxx
# Opt level: O2

void cmCMakePresetsErrors::CYCLIC_PRESET_INHERITANCE(string *presetName,cmJSONState *state)

{
  string local_30;
  
  cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[2]>
            (&local_30,(char (*) [39])"Cyclic preset inheritance for preset \"",presetName,
             (char (*) [2])0x7d34be);
  cmJSONState::AddError(state,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void CYCLIC_PRESET_INHERITANCE(const std::string& presetName,
                               cmJSONState* state)

{
  state->AddError(
    cmStrCat("Cyclic preset inheritance for preset \"", presetName, "\""));
}